

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O3

bool libcellml::traverseComponentEntityTreeLinkingUnits
               (ComponentEntityPtr *componentEntity,DescriptionList *descriptionList)

{
  element_type *peVar1;
  bool bVar2;
  bool bVar3;
  size_t sVar4;
  ulong uVar5;
  shared_ptr<libcellml::Component> component;
  ComponentPtr c;
  ComponentPtr local_68;
  ComponentEntityPtr local_50;
  ComponentEntity local_40;
  
  peVar1 = (componentEntity->
           super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 == (element_type *)0x0) {
LAB_0025d5f9:
    local_68.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_68.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    local_68.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)__dynamic_cast(peVar1,&ComponentEntity::typeinfo,&Component::typeinfo,0);
    if (local_68.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) goto LAB_0025d5f9;
    local_68.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (componentEntity->
           super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
    if (local_68.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_0025d610:
      bVar2 = linkComponentVariableUnits(&local_68,descriptionList);
      goto LAB_0025d61d;
    }
    if (__libc_single_threaded != '\0') {
      (local_68.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_68.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      goto LAB_0025d610;
    }
    LOCK();
    (local_68.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    )->_M_use_count =
         (local_68.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi)->_M_use_count + 1;
    UNLOCK();
    if (local_68.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) goto LAB_0025d610;
  }
  bVar2 = true;
LAB_0025d61d:
  uVar5 = 0;
  while( true ) {
    sVar4 = ComponentEntity::componentCount
                      ((componentEntity->
                       super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr);
    if (sVar4 <= uVar5) break;
    ComponentEntity::component
              (&local_40,
               (size_t)(componentEntity->
                       super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr);
    local_50.super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_40.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity;
    local_50.super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_40.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_40.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)
         ((long)local_40.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) =
             *(_Atomic_word *)
              ((long)local_40.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)
         ((long)local_40.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) =
             *(_Atomic_word *)
              ((long)local_40.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) + 1;
      }
    }
    bVar3 = traverseComponentEntityTreeLinkingUnits(&local_50,descriptionList);
    if (local_50.super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_50.super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_40.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_40.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
    }
    bVar2 = (bool)(bVar2 & bVar3);
    uVar5 = uVar5 + 1;
  }
  if (local_68.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return bVar2;
}

Assistant:

bool traverseComponentEntityTreeLinkingUnits(const ComponentEntityPtr &componentEntity, DescriptionList &descriptionList)
{
    auto component = std::dynamic_pointer_cast<Component>(componentEntity);
    bool status = (component != nullptr) ?
                      linkComponentVariableUnits(component, descriptionList) :
                      true;
    for (size_t index = 0; index < componentEntity->componentCount(); ++index) {
        auto c = componentEntity->component(index);
        status = traverseComponentEntityTreeLinkingUnits(c, descriptionList) && status;
    }
    return status;
}